

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void CMWriteQueuedData(transport_entry_conflict trans,CMConnection conn)

{
  queued_data_rec *__dest;
  char **ppcVar1;
  CMbuffer p_Var2;
  int iVar3;
  __pid_t _Var4;
  size_t *psVar5;
  pthread_t pVar6;
  size_t sVar7;
  size_t __n;
  long lVar8;
  char *__format;
  FILE *pFVar9;
  FFSEncodeVector pFVar10;
  size_t sVar11;
  long lVar12;
  timespec ts;
  timespec ts_1;
  
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(conn->cm,CMLowLevelVerbose);
    if (iVar3 != 0) goto LAB_0011e507;
  }
  else if (CMtrace_val[3] != 0) {
LAB_0011e507:
    if (CMtrace_PID != 0) {
      pFVar9 = (FILE *)conn->cm->CMTrace_file;
      _Var4 = getpid();
      pVar6 = pthread_self();
      fprintf(pFVar9,"P%lxT%lx - ",(long)_Var4,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,"CMWriteQueuedData, conn %p, header %zd, attr %zd\n",conn
            ,(conn->queued_data).rem_header_len,(conn->queued_data).rem_attr_len);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  sVar11 = (conn->queued_data).rem_header_len;
  if (sVar11 == 0) {
LAB_0011e638:
    sVar11 = (conn->queued_data).rem_attr_len;
    if (sVar11 != 0) {
      ts.tv_sec = (__time_t)(conn->queued_data).rem_attr_base;
      ts.tv_nsec = sVar11;
      iVar3 = (*trans->NBwritev_func)
                        (&CMstatic_trans_svcs,conn->transport_data,&ts,1,(attr_list)0x0);
      if (iVar3 == -1) goto LAB_0011e736;
      lVar8 = (long)iVar3;
      sVar11 = (conn->queued_data).rem_attr_len;
      sVar7 = sVar11 - lVar8;
      if (sVar7 != 0 && lVar8 <= (long)sVar11) {
        (conn->queued_data).rem_attr_len = sVar7;
        ppcVar1 = &(conn->queued_data).rem_attr_base;
        *ppcVar1 = *ppcVar1 + lVar8;
        iVar3 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar3 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar3 == 0) goto LAB_0011e9ed;
        if (CMtrace_PID != 0) {
          pFVar9 = (FILE *)conn->cm->CMTrace_file;
          _Var4 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar9,"P%lxT%lx - ",(long)_Var4,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts_1);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts_1.tv_sec,ts_1.tv_nsec);
        }
        sVar11 = (conn->queued_data).rem_attr_len;
        pFVar9 = (FILE *)conn->cm->CMTrace_file;
        __format = "CMWriteQueuedData, conn %p, remaining attr %zd\n";
        goto LAB_0011e9e6;
      }
    }
    pFVar10 = (conn->queued_data).vector_data;
    if (pFVar10 != (FFSEncodeVector)0x0) {
      sVar11 = 0;
      lVar8 = 0;
      for (psVar5 = &pFVar10->iov_len; ((FFSEncodeVec *)(psVar5 + -1))->iov_base != (void *)0x0;
          psVar5 = psVar5 + 2) {
        lVar8 = lVar8 + *psVar5;
        sVar11 = sVar11 + 1;
      }
      iVar3 = (*trans->NBwritev_func)
                        (&CMstatic_trans_svcs,conn->transport_data,pFVar10,sVar11,(attr_list)0x0);
      if (iVar3 == -1) goto LAB_0011e736;
      lVar12 = (long)iVar3;
      if (lVar12 < lVar8) {
        iVar3 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar3 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar3 != 0) {
          if (CMtrace_PID != 0) {
            pFVar9 = (FILE *)conn->cm->CMTrace_file;
            _Var4 = getpid();
            pVar6 = pthread_self();
            fprintf(pFVar9,"P%lxT%lx - ",(long)_Var4,pVar6);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)conn->cm->CMTrace_file,"Continued partial pending write, %zu bytes sent\n"
                  ,lVar12);
        }
        fflush((FILE *)conn->cm->CMTrace_file);
        while( true ) {
          sVar7 = pFVar10->iov_len;
          if (lVar12 - sVar7 == 0 || lVar12 < (long)sVar7) break;
          sVar11 = sVar11 - 1;
          pFVar10 = pFVar10 + 1;
          lVar12 = lVar12 - sVar7;
        }
        pFVar10->iov_len = sVar7 - lVar12;
        pFVar10->iov_base = (void *)((long)pFVar10->iov_base + lVar12);
        (conn->queued_data).vector_data = pFVar10;
        iVar3 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar3 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar3 == 0) goto LAB_0011e9ed;
        if (CMtrace_PID != 0) {
          pFVar9 = (FILE *)conn->cm->CMTrace_file;
          _Var4 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar9,"P%lxT%lx - ",(long)_Var4,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        pFVar9 = (FILE *)conn->cm->CMTrace_file;
        __format = "CMWriteQueuedData, conn %p, %zu remaining data vectors\n";
        goto LAB_0011e9e6;
      }
    }
    p_Var2 = (conn->queued_data).buffer_to_free;
    if (p_Var2 != (CMbuffer)0x0) {
      cm_return_data_buf(conn->cm,p_Var2);
    }
    conn->write_pending = 0;
    (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,0);
    iVar3 = CManager_locked(conn->cm);
    if (iVar3 == 0) {
      puts("Not LOCKED in write queued data!");
    }
  }
  else {
    __dest = &conn->queued_data;
    ts.tv_sec = (__time_t)__dest;
    ts.tv_nsec = sVar11;
    iVar3 = (*trans->NBwritev_func)(&CMstatic_trans_svcs,conn->transport_data,&ts,1,(attr_list)0x0);
    if (iVar3 != -1) {
      lVar8 = (long)iVar3;
      sVar11 = (conn->queued_data).rem_header_len;
      __n = sVar11 - lVar8;
      if (__n == 0 || (long)sVar11 < lVar8) goto LAB_0011e638;
      (conn->queued_data).rem_header_len = __n;
      memmove(__dest,__dest->rem_header + lVar8,__n);
      iVar3 = CMtrace_val[3];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(conn->cm,CMLowLevelVerbose);
      }
      if (iVar3 == 0) goto LAB_0011e9ed;
      if (CMtrace_PID != 0) {
        pFVar9 = (FILE *)conn->cm->CMTrace_file;
        _Var4 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar9,"P%lxT%lx - ",(long)_Var4,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts_1);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts_1.tv_sec,ts_1.tv_nsec);
      }
      sVar11 = (conn->queued_data).rem_header_len;
      pFVar9 = (FILE *)conn->cm->CMTrace_file;
      __format = "CMWriteQueuedData, conn %p, remaining header %zd\n";
LAB_0011e9e6:
      fprintf(pFVar9,__format,conn,sVar11);
LAB_0011e9ed:
      fflush((FILE *)conn->cm->CMTrace_file);
      return;
    }
LAB_0011e736:
    iVar3 = CMtrace_val[7];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(conn->cm,CMFreeVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar9 = (FILE *)conn->cm->CMTrace_file;
        _Var4 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar9,"P%lxT%lx - ",(long)_Var4,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,
              "Calling write failed connection failed with dereference %p\n",conn);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    INT_CMConnection_failed(conn);
    p_Var2 = (conn->queued_data).buffer_to_free;
    if (p_Var2 != (CMbuffer)0x0) {
      cm_return_data_buf(conn->cm,p_Var2);
      (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
    }
    conn->write_pending = 0;
    (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,0);
  }
  cm_wake_any_pending_write(conn);
  return;
}

Assistant:

extern void CMWriteQueuedData(transport_entry trans, CMConnection conn)
 {
     attr_list attrs = NULL;  /* GSE fix */
     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, header %zd, attr %zd\n", 
		 conn, conn->queued_data.rem_header_len, 
		 conn->queued_data.rem_attr_len);
     if (conn->queued_data.rem_header_len != 0) {
	 struct FFSEncodeVec tmp_vec[1];
	 ssize_t actual;
	 tmp_vec[0].iov_base = conn->queued_data.rem_header;
	 tmp_vec[0].iov_len = conn->queued_data.rem_header_len;
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    &tmp_vec[0], 1,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)conn->queued_data.rem_header_len) {
	     conn->queued_data.rem_header_len -= actual;
	     memmove(&conn->queued_data.rem_header[0],
		     &conn->queued_data.rem_header[actual],
		     conn->queued_data.rem_header_len);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, remaining header %zd\n", 
			 conn, conn->queued_data.rem_header_len);
	     return;
	 }
     }
     if (conn->queued_data.rem_attr_len != 0) {
	 struct FFSEncodeVec tmp_vec[1];
	 ssize_t actual;
	 tmp_vec[0].iov_base = conn->queued_data.rem_attr_base;
	 tmp_vec[0].iov_len = conn->queued_data.rem_attr_len;
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    &tmp_vec[0], 1,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)conn->queued_data.rem_attr_len) {
	     conn->queued_data.rem_attr_len -= actual;
	     conn->queued_data.rem_attr_base += actual;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, remaining attr %zd\n", 
			 conn, conn->queued_data.rem_attr_len);
	     return;
	 }
     }
     if (conn->queued_data.vector_data) {
	 size_t vec_count = 0;
	 size_t length = 0;
	 FFSEncodeVector vec = conn->queued_data.vector_data;
	 ssize_t actual = 0;

	 while(vec[vec_count].iov_base != NULL) {
	     length += vec[vec_count].iov_len;
	     vec_count++;
	 }
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    vec, vec_count,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)length) {
	     int i = 0;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "Continued partial pending write, %zu bytes sent\n", actual);
	     while (actual > (ssize_t)vec[i].iov_len) {
		 actual -= vec[i].iov_len;
		 i++;
		 vec_count--;
	     }
	     vec[i].iov_len -= actual;
	     vec[i].iov_base = (char*)vec[i].iov_base + actual;
	     conn->queued_data.vector_data = &vec[i];
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, %zu remaining data vectors\n", 
			 conn, vec_count);
	     return;
	 }
     }
     if (conn->queued_data.buffer_to_free) {
	 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
     }
     conn->write_pending = 0;
     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
				   conn->transport_data, 0);

     if(!CManager_locked(conn->cm)) {
	 printf("Not LOCKED in write queued data!\n");
     }
     cm_wake_any_pending_write(conn);
     return;
  failed:
     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
     INT_CMConnection_failed(conn);
     if (conn->queued_data.buffer_to_free) {
	 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
	 conn->queued_data.buffer_to_free = NULL;
     }
     conn->write_pending = 0;
     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
				   conn->transport_data, 0);
     cm_wake_any_pending_write(conn);
     return;
 }